

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

HistoryEntry * __thiscall
QTextBrowserPrivate::history(HistoryEntry *__return_storage_ptr__,QTextBrowserPrivate *this,int i)

{
  ulong uVar1;
  HistoryEntry *pHVar2;
  Data *pDVar3;
  HistoryEntry *pHVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (i < 1) {
    uVar1 = (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
    if (uVar1 <= (uint)-i) goto LAB_004b0671;
    pHVar4 = (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr;
    lVar5 = (long)i;
    QUrl::QUrl(&__return_storage_ptr__->url,&pHVar4[uVar1 + lVar5 + -1].url);
    pDVar3 = pHVar4[uVar1 + lVar5 + -1].title.d.d;
    (__return_storage_ptr__->title).d.d = pDVar3;
    (__return_storage_ptr__->title).d.ptr = pHVar4[uVar1 + lVar5 + -1].title.d.ptr;
    (__return_storage_ptr__->title).d.size = pHVar4[uVar1 + lVar5 + -1].title.d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    __return_storage_ptr__->type = pHVar4[uVar1 + lVar5 + -1].type;
    iVar6 = pHVar4[uVar1 + lVar5 + -1].hpos;
    iVar7 = pHVar4[uVar1 + lVar5 + -1].vpos;
    iVar8 = pHVar4[uVar1 + lVar5 + -1].focusIndicatorPosition;
    iVar9 = pHVar4[uVar1 + lVar5 + -1].focusIndicatorAnchor;
  }
  else {
    uVar1 = (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size;
    lVar5 = uVar1 - (uint)i;
    if (uVar1 < (uint)i) {
LAB_004b0671:
      QUrl::QUrl(&__return_storage_ptr__->url);
      (__return_storage_ptr__->title).d.size = 0;
      __return_storage_ptr__->hpos = 0;
      __return_storage_ptr__->vpos = 0;
      (__return_storage_ptr__->title).d.d = (Data *)0x0;
      (__return_storage_ptr__->title).d.ptr = (char16_t *)0x0;
      __return_storage_ptr__->focusIndicatorPosition = -1;
      __return_storage_ptr__->focusIndicatorAnchor = -1;
      __return_storage_ptr__->type = UnknownResource;
      return __return_storage_ptr__;
    }
    pHVar2 = (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr;
    pHVar4 = pHVar2 + lVar5;
    QUrl::QUrl(&__return_storage_ptr__->url,&pHVar4->url);
    pDVar3 = pHVar2[lVar5].title.d.d;
    (__return_storage_ptr__->title).d.d = pDVar3;
    (__return_storage_ptr__->title).d.ptr = pHVar2[lVar5].title.d.ptr;
    (__return_storage_ptr__->title).d.size = pHVar2[lVar5].title.d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    __return_storage_ptr__->type = pHVar4->type;
    iVar6 = pHVar4->hpos;
    iVar7 = pHVar4->vpos;
    iVar8 = pHVar4->focusIndicatorPosition;
    iVar9 = pHVar4->focusIndicatorAnchor;
  }
  __return_storage_ptr__->hpos = iVar6;
  __return_storage_ptr__->vpos = iVar7;
  __return_storage_ptr__->focusIndicatorPosition = iVar8;
  __return_storage_ptr__->focusIndicatorAnchor = iVar9;
  return __return_storage_ptr__;
}

Assistant:

HistoryEntry history(int i) const
    {
        if (i <= 0)
            if (-i < stack.size())
                return stack[stack.size()+i-1];
            else
                return HistoryEntry();
        else
            if (i <= forwardStack.size())
                return forwardStack[forwardStack.size()-i];
            else
                return HistoryEntry();
    }